

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

string * __thiscall
ADSBHubConnection::GetStatusText_abi_cxx11_(string *__return_storage_ptr__,ADSBHubConnection *this)

{
  int iVar1;
  long lVar2;
  char t [100];
  
  LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
  iVar1 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [6])(this);
  if ((char)iVar1 == '\0' && this->eFormat == FMT_NULL_DATA) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((this->sPublicIPv4addr)._M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  else if (((this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.thr._M_id.
            _M_thread != 0) &&
          (std::__cxx11::string::append((char *)__return_storage_ptr__),
          (this->lastData).__d.__r != 0)) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    snprintf(t,100," | last msg %.0fs ago",(double)(lVar2 - (this->lastData).__d.__r) / 1000000000.0
            );
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ADSBHubConnection::GetStatusText () const
{
    // Let's start with the standard text
    std::string s (LTChannel::GetStatusText());
    // add format of data being received
    if (!IsValid() && eFormat == FMT_NULL_DATA) {
        s += ", had received no data, verify ADSBHub 'Data Access' configuration!";
        if (!sPublicIPv4addr.empty()) {
            s += " Your public IP address appears to be ";
            s += sPublicIPv4addr;
        }
    }
    else if (isRunning()) {
        switch (eFormat) {
            case FMT_SBS:       s += " | SBS format"; break;
            case FMT_ComprVRS:  s += " | Compressed VRS format"; break;
            default:            s += " | connecting...";
        }
        // add time since last data
        if (lastData != std::chrono::time_point<std::chrono::steady_clock>()) {
            char t[100];
            std::chrono::duration<double> diff = std::chrono::steady_clock::now() - lastData;
            snprintf(t, sizeof(t), " | last msg %.0fs ago", diff.count());
            s += t;
        }
    }
    return s;
}